

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcDefinedSymbol::IfcDefinedSymbol(IfcDefinedSymbol *this)

{
  IfcDefinedSymbol *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x48,"IfcDefinedSymbol");
  IfcGeometricRepresentationItem::IfcGeometricRepresentationItem
            (&this->super_IfcGeometricRepresentationItem,&PTR_construction_vtable_24__00fa0720);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcDefinedSymbol,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcDefinedSymbol,_2UL> *)
             &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20,
             &PTR_construction_vtable_24__00fa0768);
  (this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xfa0690;
  *(undefined8 *)&this->field_0x48 = 0xfa0708;
  *(undefined8 *)
   &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xfa06b8;
  *(undefined8 *)
   &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xfa06e0;
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::shared_ptr
            ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)
             &(this->super_IfcGeometricRepresentationItem).field_0x30);
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator2D>::Lazy
            (&this->Target,(LazyObject *)0x0);
  return;
}

Assistant:

IfcDefinedSymbol() : Object("IfcDefinedSymbol") {}